

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uloc_tag.cpp
# Opt level: O0

UBool ultag_isUnicodeLocaleType_63(char *s,int32_t len)

{
  UBool UVar1;
  size_t sVar2;
  int local_2c;
  char *pcStack_28;
  int32_t subtagLen;
  char *p;
  int32_t len_local;
  char *s_local;
  
  local_2c = 0;
  pcStack_28 = s;
  p._4_4_ = len;
  if (len < 0) {
    sVar2 = strlen(s);
    p._4_4_ = (int32_t)sVar2;
  }
  do {
    if (p._4_4_ < 1) {
      return 2 < local_2c;
    }
    if (*pcStack_28 == '-') {
      if (local_2c < 3) {
        return '\0';
      }
      local_2c = 0;
    }
    else {
      UVar1 = uprv_isASCIILetter_63(*pcStack_28);
      if ((UVar1 == '\0') && ((*pcStack_28 < '0' || ('9' < *pcStack_28)))) {
        return '\0';
      }
      local_2c = local_2c + 1;
      if (8 < local_2c) {
        return '\0';
      }
    }
    pcStack_28 = pcStack_28 + 1;
    p._4_4_ = p._4_4_ + -1;
  } while( true );
}

Assistant:

U_CFUNC UBool
ultag_isUnicodeLocaleType(const char*s, int32_t len) {
    const char* p;
    int32_t subtagLen = 0;

    if (len < 0) {
        len = (int32_t)uprv_strlen(s);
    }

    for (p = s; len > 0; p++, len--) {
        if (*p == SEP) {
            if (subtagLen < 3) {
                return FALSE;
            }
            subtagLen = 0;
        } else if (ISALPHA(*p) || ISNUMERIC(*p)) {
            subtagLen++;
            if (subtagLen > 8) {
                return FALSE;
            }
        } else {
            return FALSE;
        }
    }

    return (subtagLen >= 3);
}